

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjedi_index_impl.h
# Opt level: O0

void __thiscall
json::QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
find_smallest(QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
              *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *cost_matrix,unsigned_long *matrix_size,
             vector<double,_std::allocator<double>_> *row_cover,
             vector<double,_std::allocator<double>_> *col_cover,double *min_val)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  ulong local_48;
  unsigned_long c;
  unsigned_long r;
  double *min_val_local;
  vector<double,_std::allocator<double>_> *col_cover_local;
  vector<double,_std::allocator<double>_> *row_cover_local;
  unsigned_long *matrix_size_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *cost_matrix_local;
  QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
  *this_local;
  
  for (c = 0; c < *matrix_size; c = c + 1) {
    for (local_48 = 0; local_48 < *matrix_size; local_48 = local_48 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](row_cover,c);
      if ((*pvVar2 == 0.0) && (!NAN(*pvVar2))) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](col_cover,local_48);
        if ((*pvVar2 == 0.0) && (!NAN(*pvVar2))) {
          dVar1 = *min_val;
          pvVar3 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](cost_matrix,c);
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,local_48);
          if (*pvVar2 <= dVar1 && dVar1 != *pvVar2) {
            pvVar3 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](cost_matrix,c);
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,local_48);
            *min_val = *pvVar2;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void QuickJEDITreeIndex<cost_matrixModel, TreeIndex>::find_smallest(
    std::vector<std::vector<double> >& cost_matrix,
    unsigned long& matrix_size,
    std::vector<double>& row_cover,
    std::vector<double>& col_cover,
    double& min_val)
{
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      if (row_cover[r] == 0 && col_cover[c] == 0)
      {
        if (min_val > cost_matrix[r][c])
        {
          min_val = cost_matrix[r][c];
        }
      }
    }
  }
}